

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_list.c
# Opt level: O0

void test_for_each_reverse_save_macro(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  bool local_91;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  int j;
  int i;
  list_element *ptr;
  list_element *e;
  
  cunit_start_test("test_for_each_reverse_save_macro");
  head.prev = &head;
  head.next = &head;
  add_elements(elements1,false);
  __tempptr._4_4_ = 0;
  __tempptr._0_4_ = 5;
  ptr = (list_element *)&head.prev[-1].prev;
  plVar1 = (head.prev)->prev;
  while (_j = &plVar1[-1].prev, (ptr->node).next != head.next) {
    cunit_named_check(ptr == elements1 + (int)__tempptr,"test_for_each_reverse_save_macro",0x17a,
                      "for_each_save iteration %d failed",(ulong)__tempptr._4_4_);
    plVar2 = (ptr->node).prev;
    plVar3 = (ptr->node).next;
    plVar2->next = plVar3;
    plVar3->prev = plVar2;
    (ptr->node).prev = (list_entity *)0x0;
    (ptr->node).next = (list_entity *)0x0;
    __tempptr._4_4_ = __tempptr._4_4_ + 1;
    __tempptr._0_4_ = (int)__tempptr + -1;
    ptr = (list_element *)_j;
    plVar1 = plVar1->prev;
  }
  cunit_named_check(__tempptr._4_4_ == 6,"test_for_each_reverse_save_macro",0x17f,
                    "for_each_save only had %d of %d iterations",(ulong)__tempptr._4_4_,6);
  local_91 = head.next == &head && head.prev == &head;
  cunit_named_check(local_91,"test_for_each_reverse_save_macro",0x180,
                    "for_each_save list not empty after loop with remove");
  cunit_end_test("test_for_each_reverse_save_macro");
  return;
}

Assistant:

static void test_for_each_reverse_save_macro(void) {
  struct list_element *e, *ptr;
  int i,j;

  START_TEST();
  list_init_head(&head);
  add_elements(elements1, false);

  i = 0;
  j = COUNT - 1;
  list_for_each_element_reverse_safe(&head, e, node, ptr) {
    CHECK_TRUE(e == &elements1[j], "for_each_save iteration %d failed", i);
    list_remove(&e->node);
    i++;
    j--;
  }
  CHECK_TRUE(i == COUNT, "for_each_save only had %d of %d iterations", i, COUNT);
  CHECK_TRUE(list_is_empty(&head), "for_each_save list not empty after loop with remove");
  END_TEST();
}